

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_block.h
# Opt level: O1

void __thiscall
vector_block<unsigned_char_*,_1024U>::push_back
          (vector_block<unsigned_char_*,_1024U> *this,uchar **t)

{
  uchar *puVar1;
  uchar **ppuVar2;
  
  if (this->_left_in_block == 0) {
    vector_block<unsigned_char*,1024u>::push_back();
  }
  puVar1 = *t;
  ppuVar2 = this->_insertpos;
  this->_insertpos = ppuVar2 + 1;
  *ppuVar2 = puVar1;
  this->_left_in_block = this->_left_in_block - 1;
  return;
}

Assistant:

void push_back(const T& t)
	{
		if (__builtin_expect(is_full(), false)) {
			_insertpos = static_cast<T*>(malloc(B*sizeof(T)));
			_index_block.push_back(_insertpos);
			_left_in_block = B;
		}
		*_insertpos++ = t;
		--_left_in_block;
	}